

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

mz_bool (anonymous_namespace)::miniz::tdefl_compress_normal(tdefl_compressor *d)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  byte *pbVar9;
  tdefl_compressor *d_00;
  long in_RDI;
  bool bVar10;
  int n;
  mz_uint8 c_2;
  mz_uint hash_1;
  mz_uint ins_pos_1;
  mz_uint dst_pos_1;
  mz_uint8 c_1;
  mz_uint8 c;
  mz_uint8 *pSrc_end;
  mz_uint num_bytes_to_process;
  mz_uint hash;
  mz_uint ins_pos;
  mz_uint dst_pos;
  mz_uint cur_pos;
  mz_uint cur_match_len;
  mz_uint cur_match_dist;
  mz_uint len_to_move;
  tdefl_flush flush;
  size_t src_buf_left;
  mz_uint8 *pSrc;
  mz_uint8 c1;
  mz_uint8 c0;
  mz_uint8 *q;
  mz_uint8 *p;
  mz_uint8 *s;
  mz_uint num_probes_left;
  mz_uint probe_len;
  mz_uint next_probe_pos;
  mz_uint probe_pos;
  mz_uint match_len;
  mz_uint pos;
  mz_uint dist;
  mz_uint32 s1_2;
  mz_uint32 s0_2;
  mz_uint32 s1_1;
  mz_uint32 s0_1;
  mz_uint32 s1;
  mz_uint32 s0;
  int local_1b4;
  ulong local_1b0;
  ulong local_188;
  uint local_14c;
  int local_148;
  tdefl_compressor *local_140;
  uint local_108;
  uint local_104;
  uint local_100;
  uint local_f8;
  uint local_f4;
  uint local_f0;
  int flush_00;
  byte *local_e0;
  char local_ca;
  char local_c9;
  char *local_c8;
  char *local_c0;
  int local_ac;
  uint local_a8;
  uint local_a0;
  uint local_9c;
  uint local_94;
  
  local_e0 = *(byte **)(in_RDI + 0xb0);
  d_00 = *(tdefl_compressor **)(in_RDI + 0xb8);
  flush_00 = *(int *)(in_RDI + 0xa8);
  while( true ) {
    bVar10 = true;
    if ((d_00 == (tdefl_compressor *)0x0) && (bVar10 = false, flush_00 != 0)) {
      bVar10 = *(int *)(in_RDI + 0x28) != 0;
    }
    if (!bVar10) break;
    if ((uint)(*(int *)(in_RDI + 0x28) + *(int *)(in_RDI + 0x2c)) < 2) {
      while( true ) {
        bVar10 = false;
        if (d_00 != (tdefl_compressor *)0x0) {
          bVar10 = *(uint *)(in_RDI + 0x28) < 0x102;
        }
        if (!bVar10) break;
        pbVar9 = local_e0 + 1;
        bVar4 = *local_e0;
        uVar6 = *(int *)(in_RDI + 0x24) + *(int *)(in_RDI + 0x28) & 0x7fff;
        d_00 = (tdefl_compressor *)&d_00[-1].field_0x4df77;
        *(byte *)(in_RDI + 200 + (ulong)uVar6) = bVar4;
        if (uVar6 < 0x101) {
          *(byte *)(in_RDI + 200 + (ulong)(uVar6 + 0x8000)) = bVar4;
        }
        iVar5 = *(int *)(in_RDI + 0x28) + 1;
        *(int *)(in_RDI + 0x28) = iVar5;
        local_e0 = pbVar9;
        if (2 < (uint)(iVar5 + *(int *)(in_RDI + 0x2c))) {
          iVar5 = *(int *)(in_RDI + 0x24) + *(int *)(in_RDI + 0x28);
          uVar6 = iVar5 - 3;
          uVar8 = ((uint)*(byte *)(in_RDI + 200 + (ulong)(uVar6 & 0x7fff)) << 10 ^
                   (uint)*(byte *)(in_RDI + 200 + (ulong)(iVar5 - 2U & 0x7fff)) << 5 ^ (uint)bVar4)
                  & 0x7fff;
          *(undefined2 *)(in_RDI + 0x192aa + (ulong)(uVar6 & 0x7fff) * 2) =
               *(undefined2 *)(in_RDI + 0x292aa + (ulong)uVar8 * 2);
          *(short *)(in_RDI + 0x292aa + (ulong)uVar8 * 2) = (short)uVar6;
        }
      }
    }
    else {
      local_100 = *(int *)(in_RDI + 0x24) + *(int *)(in_RDI + 0x28);
      iVar5 = *(int *)(in_RDI + 0x24) + *(int *)(in_RDI + 0x28);
      local_104 = iVar5 - 2;
      local_108 = (uint)*(byte *)(in_RDI + 200 + (ulong)(local_104 & 0x7fff)) << 5 ^
                  (uint)*(byte *)(in_RDI + 200 + (ulong)(iVar5 - 1U & 0x7fff));
      local_140 = d_00;
      if ((tdefl_compressor *)(ulong)(0x102 - *(int *)(in_RDI + 0x28)) <= d_00) {
        local_140 = (tdefl_compressor *)(ulong)(0x102 - *(int *)(in_RDI + 0x28));
      }
      pbVar9 = local_e0 + ((ulong)local_140 & 0xffffffff);
      d_00 = (tdefl_compressor *)((long)d_00 - ((ulong)local_140 & 0xffffffff));
      *(int *)(in_RDI + 0x28) = (int)local_140 + *(int *)(in_RDI + 0x28);
      while (local_100 = local_100 & 0x7fff, local_e0 != pbVar9) {
        bVar4 = *local_e0;
        *(byte *)(in_RDI + 200 + (ulong)local_100) = bVar4;
        if (local_100 < 0x101) {
          *(byte *)(in_RDI + 200 + (ulong)(local_100 + 0x8000)) = bVar4;
        }
        local_108 = (local_108 << 5 ^ (uint)bVar4) & 0x7fff;
        *(undefined2 *)(in_RDI + 0x192aa + (ulong)(local_104 & 0x7fff) * 2) =
             *(undefined2 *)(in_RDI + 0x292aa + (ulong)local_108 * 2);
        *(short *)(in_RDI + 0x292aa + (ulong)local_108 * 2) = (short)local_104;
        local_100 = local_100 + 1;
        local_104 = local_104 + 1;
        local_e0 = local_e0 + 1;
      }
    }
    if (0x8000U - *(int *)(in_RDI + 0x28) < *(uint *)(in_RDI + 0x2c)) {
      local_148 = 0x8000 - *(int *)(in_RDI + 0x28);
    }
    else {
      local_148 = *(int *)(in_RDI + 0x2c);
    }
    *(int *)(in_RDI + 0x2c) = local_148;
    if ((flush_00 == 0) && (*(uint *)(in_RDI + 0x28) < 0x102)) break;
    local_f0 = 1;
    local_f4 = 0;
    if (*(int *)(in_RDI + 0x68) == 0) {
      local_14c = 2;
    }
    else {
      local_14c = *(uint *)(in_RDI + 0x68);
    }
    local_f8 = local_14c;
    uVar6 = *(uint *)(in_RDI + 0x24) & 0x7fff;
    if ((*(uint *)(in_RDI + 0x10) & 0x90000) == 0) {
      uVar8 = *(uint *)(in_RDI + 0x24);
      uVar1 = *(uint *)(in_RDI + 0x2c);
      uVar2 = *(uint *)(in_RDI + 0x28);
      uVar7 = uVar8 & 0x7fff;
      local_9c = local_14c;
      local_ac = *(int *)(in_RDI + 0x14 + (ulong)(0x1f < local_14c) * 4);
      local_c9 = *(char *)(in_RDI + 200 + (ulong)(uVar7 + local_14c));
      local_ca = *(char *)(in_RDI + 200 + (ulong)((uVar7 + local_14c) - 1));
      if (0x102 < uVar2) {
        __assert_fail("max_match_len <= TDEFL_MAX_MATCH_LEN",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/CGL/include/CGL/tinyexr.h"
                      ,0xdd0,
                      "void (anonymous namespace)::miniz::tdefl_find_match(tdefl_compressor *, mz_uint, mz_uint, mz_uint, mz_uint *, mz_uint *)"
                     );
      }
      local_a0 = uVar7;
      if (local_14c < uVar2) {
LAB_00185fe0:
        local_ac = local_ac + -1;
        if (((local_ac != 0) &&
            (local_a0 = (uint)*(ushort *)(in_RDI + 0x192aa + (ulong)local_a0 * 2), local_a0 != 0))
           && (local_94 = uVar8 - local_a0 & 0xffff, local_94 <= uVar1)) {
          local_a0 = local_a0 & 0x7fff;
          if ((*(char *)(in_RDI + 200 + (ulong)(local_a0 + local_9c)) == local_c9) &&
             (*(char *)(in_RDI + 200 + (ulong)((local_a0 + local_9c) - 1)) == local_ca))
          goto LAB_00186240;
          local_a0 = (uint)*(ushort *)(in_RDI + 0x192aa + (ulong)local_a0 * 2);
          if ((local_a0 != 0) && (local_94 = uVar8 - local_a0 & 0xffff, local_94 <= uVar1)) {
            local_a0 = local_a0 & 0x7fff;
            if ((*(char *)(in_RDI + 200 + (ulong)(local_a0 + local_9c)) == local_c9) &&
               (*(char *)(in_RDI + 200 + (ulong)((local_a0 + local_9c) - 1)) == local_ca))
            goto LAB_00186240;
            local_a0 = (uint)*(ushort *)(in_RDI + 0x192aa + (ulong)local_a0 * 2);
            if ((local_a0 != 0) && (local_94 = uVar8 - local_a0 & 0xffff, local_94 <= uVar1))
            goto LAB_001861cb;
          }
        }
      }
    }
    else if ((*(int *)(in_RDI + 0x2c) != 0) && ((*(uint *)(in_RDI + 0x10) & 0x80000) == 0)) {
      local_f8 = 0;
      while ((local_f8 < *(uint *)(in_RDI + 0x28) &&
             (*(char *)(in_RDI + 200 + (ulong)(uVar6 + local_f8)) ==
              *(char *)(in_RDI + 200 + (ulong)(uVar6 - 1 & 0x7fff))))) {
        local_f8 = local_f8 + 1;
      }
      bVar10 = 2 < local_f8;
      if (!bVar10) {
        local_f8 = 0;
      }
      local_f4 = (uint)bVar10;
    }
LAB_00186385:
    if ((((local_f8 == 3) && (0x1fff < local_f4)) || (uVar6 == local_f4)) ||
       (((*(uint *)(in_RDI + 0x10) & 0x20000) != 0 && (local_f8 < 6)))) {
      local_f8 = 0;
      local_f4 = 0;
    }
    if (*(int *)(in_RDI + 0x68) == 0) {
      if (local_f4 == 0) {
        if (uVar6 < 0x8100) {
          local_188 = (ulong)uVar6;
        }
        else {
          local_188 = 0x8100;
        }
        bVar4 = *(byte *)(in_RDI + 200 + local_188);
        *(int *)(in_RDI + 0x54) = *(int *)(in_RDI + 0x54) + 1;
        pbVar9 = *(byte **)(in_RDI + 0x30);
        *(byte **)(in_RDI + 0x30) = pbVar9 + 1;
        *pbVar9 = bVar4;
        **(undefined1 **)(in_RDI + 0x38) = (char)((int)(uint)**(byte **)(in_RDI + 0x38) >> 1);
        iVar5 = *(int *)(in_RDI + 0x50) + -1;
        *(int *)(in_RDI + 0x50) = iVar5;
        if (iVar5 == 0) {
          *(undefined4 *)(in_RDI + 0x50) = 8;
          lVar3 = *(long *)(in_RDI + 0x30);
          *(long *)(in_RDI + 0x30) = lVar3 + 1;
          *(long *)(in_RDI + 0x38) = lVar3;
        }
        *(short *)(in_RDI + 0x81ca + (ulong)bVar4 * 2) =
             *(short *)(in_RDI + 0x81ca + (ulong)bVar4 * 2) + 1;
      }
      else if (((*(int *)(in_RDI + 0x1c) == 0) && ((*(uint *)(in_RDI + 0x10) & 0x10000) == 0)) &&
              (local_f8 < 0x80)) {
        if (uVar6 < 0x8100) {
          local_1b0 = (ulong)uVar6;
        }
        else {
          local_1b0 = 0x8100;
        }
        *(uint *)(in_RDI + 0x6c) = (uint)*(byte *)(in_RDI + 200 + local_1b0);
        *(uint *)(in_RDI + 100) = local_f4;
        *(uint *)(in_RDI + 0x68) = local_f8;
      }
      else {
        bVar10 = false;
        if ((2 < local_f8) && (bVar10 = false, local_f4 != 0)) {
          bVar10 = local_f4 < 0x8001;
        }
        if (!bVar10) {
          __assert_fail("(match_len >= TDEFL_MIN_MATCH_LEN) && (match_dist >= 1) && (match_dist <= TDEFL_LZ_DICT_SIZE)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/CGL/include/CGL/tinyexr.h"
                        ,0xebd,
                        "void (anonymous namespace)::miniz::tdefl_record_match(tdefl_compressor *, mz_uint, mz_uint)"
                       );
        }
        *(uint *)(in_RDI + 0x54) = local_f8 + *(int *)(in_RDI + 0x54);
        **(char **)(in_RDI + 0x30) = (char)local_f8 + -3;
        local_f4 = local_f4 - 1;
        *(char *)(*(long *)(in_RDI + 0x30) + 1) = (char)local_f4;
        *(char *)(*(long *)(in_RDI + 0x30) + 2) = (char)(local_f4 >> 8);
        *(long *)(in_RDI + 0x30) = *(long *)(in_RDI + 0x30) + 3;
        **(byte **)(in_RDI + 0x38) = (byte)((int)(uint)**(byte **)(in_RDI + 0x38) >> 1) | 0x80;
        iVar5 = *(int *)(in_RDI + 0x50) + -1;
        *(int *)(in_RDI + 0x50) = iVar5;
        if (iVar5 == 0) {
          *(undefined4 *)(in_RDI + 0x50) = 8;
          lVar3 = *(long *)(in_RDI + 0x30);
          *(long *)(in_RDI + 0x30) = lVar3 + 1;
          *(long *)(in_RDI + 0x38) = lVar3;
        }
        bVar4 = ""[local_f4 >> 8 & 0x7f];
        if (local_f4 < 0x200) {
          bVar4 = ""[local_f4 & 0x1ff];
        }
        *(short *)(in_RDI + 0x840a + (ulong)bVar4 * 2) =
             *(short *)(in_RDI + 0x840a + (ulong)bVar4 * 2) + 1;
        if (2 < local_f8) {
          *(short *)(in_RDI + 0x81ca + (ulong)s_tdefl_len_sym[local_f8 - 3] * 2) =
               *(short *)(in_RDI + 0x81ca + (ulong)s_tdefl_len_sym[local_f8 - 3] * 2) + 1;
        }
        local_f0 = local_f8;
      }
    }
    else if (*(uint *)(in_RDI + 0x68) < local_f8) {
      bVar4 = (byte)*(undefined4 *)(in_RDI + 0x6c);
      *(int *)(in_RDI + 0x54) = *(int *)(in_RDI + 0x54) + 1;
      pbVar9 = *(byte **)(in_RDI + 0x30);
      *(byte **)(in_RDI + 0x30) = pbVar9 + 1;
      *pbVar9 = bVar4;
      **(undefined1 **)(in_RDI + 0x38) = (char)((int)(uint)**(byte **)(in_RDI + 0x38) >> 1);
      iVar5 = *(int *)(in_RDI + 0x50) + -1;
      *(int *)(in_RDI + 0x50) = iVar5;
      if (iVar5 == 0) {
        *(undefined4 *)(in_RDI + 0x50) = 8;
        lVar3 = *(long *)(in_RDI + 0x30);
        *(long *)(in_RDI + 0x30) = lVar3 + 1;
        *(long *)(in_RDI + 0x38) = lVar3;
      }
      *(short *)(in_RDI + 0x81ca + (ulong)bVar4 * 2) =
           *(short *)(in_RDI + 0x81ca + (ulong)bVar4 * 2) + 1;
      if (local_f8 < 0x80) {
        *(uint *)(in_RDI + 0x6c) = (uint)*(byte *)(in_RDI + 200 + (ulong)uVar6);
        *(uint *)(in_RDI + 100) = local_f4;
        *(uint *)(in_RDI + 0x68) = local_f8;
      }
      else {
        bVar10 = false;
        if ((2 < local_f8) && (bVar10 = false, local_f4 != 0)) {
          bVar10 = local_f4 < 0x8001;
        }
        if (!bVar10) {
          __assert_fail("(match_len >= TDEFL_MIN_MATCH_LEN) && (match_dist >= 1) && (match_dist <= TDEFL_LZ_DICT_SIZE)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/CGL/include/CGL/tinyexr.h"
                        ,0xebd,
                        "void (anonymous namespace)::miniz::tdefl_record_match(tdefl_compressor *, mz_uint, mz_uint)"
                       );
        }
        *(uint *)(in_RDI + 0x54) = local_f8 + *(int *)(in_RDI + 0x54);
        **(char **)(in_RDI + 0x30) = (char)local_f8 + -3;
        local_f4 = local_f4 - 1;
        *(char *)(*(long *)(in_RDI + 0x30) + 1) = (char)local_f4;
        *(char *)(*(long *)(in_RDI + 0x30) + 2) = (char)(local_f4 >> 8);
        *(long *)(in_RDI + 0x30) = *(long *)(in_RDI + 0x30) + 3;
        **(byte **)(in_RDI + 0x38) = (byte)((int)(uint)**(byte **)(in_RDI + 0x38) >> 1) | 0x80;
        iVar5 = *(int *)(in_RDI + 0x50) + -1;
        *(int *)(in_RDI + 0x50) = iVar5;
        if (iVar5 == 0) {
          *(undefined4 *)(in_RDI + 0x50) = 8;
          lVar3 = *(long *)(in_RDI + 0x30);
          *(long *)(in_RDI + 0x30) = lVar3 + 1;
          *(long *)(in_RDI + 0x38) = lVar3;
        }
        bVar4 = ""[local_f4 >> 8 & 0x7f];
        if (local_f4 < 0x200) {
          bVar4 = ""[local_f4 & 0x1ff];
        }
        *(short *)(in_RDI + 0x840a + (ulong)bVar4 * 2) =
             *(short *)(in_RDI + 0x840a + (ulong)bVar4 * 2) + 1;
        if (2 < local_f8) {
          *(short *)(in_RDI + 0x81ca + (ulong)s_tdefl_len_sym[local_f8 - 3] * 2) =
               *(short *)(in_RDI + 0x81ca + (ulong)s_tdefl_len_sym[local_f8 - 3] * 2) + 1;
        }
        *(undefined4 *)(in_RDI + 0x68) = 0;
        local_f0 = local_f8;
      }
    }
    else {
      uVar6 = *(uint *)(in_RDI + 0x68);
      uVar8 = *(uint *)(in_RDI + 100);
      bVar10 = false;
      if ((2 < uVar6) && (bVar10 = false, uVar8 != 0)) {
        bVar10 = uVar8 < 0x8001;
      }
      if (!bVar10) {
        __assert_fail("(match_len >= TDEFL_MIN_MATCH_LEN) && (match_dist >= 1) && (match_dist <= TDEFL_LZ_DICT_SIZE)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/CGL/include/CGL/tinyexr.h"
                      ,0xebd,
                      "void (anonymous namespace)::miniz::tdefl_record_match(tdefl_compressor *, mz_uint, mz_uint)"
                     );
      }
      *(uint *)(in_RDI + 0x54) = uVar6 + *(int *)(in_RDI + 0x54);
      **(char **)(in_RDI + 0x30) = (char)uVar6 + -3;
      uVar8 = uVar8 - 1;
      *(char *)(*(long *)(in_RDI + 0x30) + 1) = (char)uVar8;
      *(char *)(*(long *)(in_RDI + 0x30) + 2) = (char)(uVar8 >> 8);
      *(long *)(in_RDI + 0x30) = *(long *)(in_RDI + 0x30) + 3;
      **(byte **)(in_RDI + 0x38) = (byte)((int)(uint)**(byte **)(in_RDI + 0x38) >> 1) | 0x80;
      iVar5 = *(int *)(in_RDI + 0x50) + -1;
      *(int *)(in_RDI + 0x50) = iVar5;
      if (iVar5 == 0) {
        *(undefined4 *)(in_RDI + 0x50) = 8;
        lVar3 = *(long *)(in_RDI + 0x30);
        *(long *)(in_RDI + 0x30) = lVar3 + 1;
        *(long *)(in_RDI + 0x38) = lVar3;
      }
      bVar4 = ""[uVar8 >> 8 & 0x7f];
      if (uVar8 < 0x200) {
        bVar4 = ""[uVar8 & 0x1ff];
      }
      *(short *)(in_RDI + 0x840a + (ulong)bVar4 * 2) =
           *(short *)(in_RDI + 0x840a + (ulong)bVar4 * 2) + 1;
      if (2 < uVar6) {
        *(short *)(in_RDI + 0x81ca + (ulong)s_tdefl_len_sym[uVar6 - 3] * 2) =
             *(short *)(in_RDI + 0x81ca + (ulong)s_tdefl_len_sym[uVar6 - 3] * 2) + 1;
      }
      local_f0 = *(int *)(in_RDI + 0x68) - 1;
      *(undefined4 *)(in_RDI + 0x68) = 0;
    }
    *(uint *)(in_RDI + 0x24) = local_f0 + *(int *)(in_RDI + 0x24);
    if (*(uint *)(in_RDI + 0x28) < local_f0) {
      __assert_fail("d->m_lookahead_size >= len_to_move",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/CGL/include/CGL/tinyexr.h"
                    ,0xf4e,
                    "mz_bool (anonymous namespace)::miniz::tdefl_compress_normal(tdefl_compressor *)"
                   );
    }
    *(uint *)(in_RDI + 0x28) = *(int *)(in_RDI + 0x28) - local_f0;
    if (*(int *)(in_RDI + 0x2c) + local_f0 < 0x8000) {
      local_1b4 = *(int *)(in_RDI + 0x2c) + local_f0;
    }
    else {
      local_1b4 = 0x8000;
    }
    *(int *)(in_RDI + 0x2c) = local_1b4;
    if ((in_RDI + 0x192a2U < *(ulong *)(in_RDI + 0x30)) ||
       ((0x7c00 < *(uint *)(in_RDI + 0x54) &&
        ((*(uint *)(in_RDI + 0x54) <=
          (uint)(((int)*(undefined8 *)(in_RDI + 0x30) - ((int)in_RDI + 0x92aa)) * 0x73) >> 7 ||
         ((*(uint *)(in_RDI + 0x10) & 0x80000) != 0)))))) {
      *(byte **)(in_RDI + 0xb0) = local_e0;
      *(tdefl_compressor **)(in_RDI + 0xb8) = d_00;
      iVar5 = tdefl_flush_block(d_00,flush_00);
      if (iVar5 != 0) {
        return (uint)(-1 < iVar5);
      }
    }
  }
  *(byte **)(in_RDI + 0xb0) = local_e0;
  *(tdefl_compressor **)(in_RDI + 0xb8) = d_00;
  return 1;
LAB_001861cb:
  local_a0 = local_a0 & 0x7fff;
  if ((*(char *)(in_RDI + 200 + (ulong)(local_a0 + local_9c)) == local_c9) &&
     (*(char *)(in_RDI + 200 + (ulong)((local_a0 + local_9c) - 1)) == local_ca)) {
LAB_00186240:
    if (local_94 == 0) goto LAB_00186385;
    local_c8 = (char *)(in_RDI + 200 + (ulong)local_a0);
    local_c0 = (char *)(in_RDI + 200 + (ulong)uVar7);
    for (local_a8 = 0; local_a8 < uVar2; local_a8 = local_a8 + 1) {
      if (*local_c0 != *local_c8) break;
      local_c8 = local_c8 + 1;
      local_c0 = local_c0 + 1;
    }
    if (local_9c < local_a8) {
      local_f4 = local_94;
      local_9c = local_a8;
      local_f8 = local_a8;
      if (local_a8 == uVar2) goto LAB_00186385;
      local_c9 = *(char *)(in_RDI + 200 + (ulong)(uVar7 + local_a8));
      local_ca = *(char *)(in_RDI + 200 + (ulong)((uVar7 + local_a8) - 1));
    }
  }
  goto LAB_00185fe0;
}

Assistant:

static mz_bool tdefl_compress_normal(tdefl_compressor *d) {
  const mz_uint8 *pSrc = d->m_pSrc;
  size_t src_buf_left = d->m_src_buf_left;
  tdefl_flush flush = d->m_flush;

  while ((src_buf_left) || ((flush) && (d->m_lookahead_size))) {
    mz_uint len_to_move, cur_match_dist, cur_match_len, cur_pos;
    // Update dictionary and hash chains. Keeps the lookahead size equal to
    // TDEFL_MAX_MATCH_LEN.
    if ((d->m_lookahead_size + d->m_dict_size) >= (TDEFL_MIN_MATCH_LEN - 1)) {
      mz_uint dst_pos = (d->m_lookahead_pos + d->m_lookahead_size) &
                        TDEFL_LZ_DICT_SIZE_MASK,
              ins_pos = d->m_lookahead_pos + d->m_lookahead_size - 2;
      mz_uint hash = (d->m_dict[ins_pos & TDEFL_LZ_DICT_SIZE_MASK]
                      << TDEFL_LZ_HASH_SHIFT) ^
                     d->m_dict[(ins_pos + 1) & TDEFL_LZ_DICT_SIZE_MASK];
      mz_uint num_bytes_to_process = (mz_uint)MZ_MIN(
          src_buf_left, TDEFL_MAX_MATCH_LEN - d->m_lookahead_size);
      const mz_uint8 *pSrc_end = pSrc + num_bytes_to_process;
      src_buf_left -= num_bytes_to_process;
      d->m_lookahead_size += num_bytes_to_process;
      while (pSrc != pSrc_end) {
        mz_uint8 c = *pSrc++;
        d->m_dict[dst_pos] = c;
        if (dst_pos < (TDEFL_MAX_MATCH_LEN - 1))
          d->m_dict[TDEFL_LZ_DICT_SIZE + dst_pos] = c;
        hash = ((hash << TDEFL_LZ_HASH_SHIFT) ^ c) & (TDEFL_LZ_HASH_SIZE - 1);
        d->m_next[ins_pos & TDEFL_LZ_DICT_SIZE_MASK] = d->m_hash[hash];
        d->m_hash[hash] = (mz_uint16)(ins_pos);
        dst_pos = (dst_pos + 1) & TDEFL_LZ_DICT_SIZE_MASK;
        ins_pos++;
      }
    } else {
      while ((src_buf_left) && (d->m_lookahead_size < TDEFL_MAX_MATCH_LEN)) {
        mz_uint8 c = *pSrc++;
        mz_uint dst_pos = (d->m_lookahead_pos + d->m_lookahead_size) &
                          TDEFL_LZ_DICT_SIZE_MASK;
        src_buf_left--;
        d->m_dict[dst_pos] = c;
        if (dst_pos < (TDEFL_MAX_MATCH_LEN - 1))
          d->m_dict[TDEFL_LZ_DICT_SIZE + dst_pos] = c;
        if ((++d->m_lookahead_size + d->m_dict_size) >= TDEFL_MIN_MATCH_LEN) {
          mz_uint ins_pos = d->m_lookahead_pos + (d->m_lookahead_size - 1) - 2;
          mz_uint hash = ((d->m_dict[ins_pos & TDEFL_LZ_DICT_SIZE_MASK]
                           << (TDEFL_LZ_HASH_SHIFT * 2)) ^
                          (d->m_dict[(ins_pos + 1) & TDEFL_LZ_DICT_SIZE_MASK]
                           << TDEFL_LZ_HASH_SHIFT) ^
                          c) &
                         (TDEFL_LZ_HASH_SIZE - 1);
          d->m_next[ins_pos & TDEFL_LZ_DICT_SIZE_MASK] = d->m_hash[hash];
          d->m_hash[hash] = (mz_uint16)(ins_pos);
        }
      }
    }
    d->m_dict_size =
        MZ_MIN(TDEFL_LZ_DICT_SIZE - d->m_lookahead_size, d->m_dict_size);
    if ((!flush) && (d->m_lookahead_size < TDEFL_MAX_MATCH_LEN))
      break;

    // Simple lazy/greedy parsing state machine.
    len_to_move = 1;
    cur_match_dist = 0;
    cur_match_len =
        d->m_saved_match_len ? d->m_saved_match_len : (TDEFL_MIN_MATCH_LEN - 1);
    cur_pos = d->m_lookahead_pos & TDEFL_LZ_DICT_SIZE_MASK;
    if (d->m_flags & (TDEFL_RLE_MATCHES | TDEFL_FORCE_ALL_RAW_BLOCKS)) {
      if ((d->m_dict_size) && (!(d->m_flags & TDEFL_FORCE_ALL_RAW_BLOCKS))) {
        mz_uint8 c = d->m_dict[(cur_pos - 1) & TDEFL_LZ_DICT_SIZE_MASK];
        cur_match_len = 0;
        while (cur_match_len < d->m_lookahead_size) {
          if (d->m_dict[cur_pos + cur_match_len] != c)
            break;
          cur_match_len++;
        }
        if (cur_match_len < TDEFL_MIN_MATCH_LEN)
          cur_match_len = 0;
        else
          cur_match_dist = 1;
      }
    } else {
      tdefl_find_match(d, d->m_lookahead_pos, d->m_dict_size,
                       d->m_lookahead_size, &cur_match_dist, &cur_match_len);
    }
    if (((cur_match_len == TDEFL_MIN_MATCH_LEN) &&
         (cur_match_dist >= 8U * 1024U)) ||
        (cur_pos == cur_match_dist) ||
        ((d->m_flags & TDEFL_FILTER_MATCHES) && (cur_match_len <= 5))) {
      cur_match_dist = cur_match_len = 0;
    }
    if (d->m_saved_match_len) {
      if (cur_match_len > d->m_saved_match_len) {
        tdefl_record_literal(d, (mz_uint8)d->m_saved_lit);
        if (cur_match_len >= 128) {
          tdefl_record_match(d, cur_match_len, cur_match_dist);
          d->m_saved_match_len = 0;
          len_to_move = cur_match_len;
        } else {
          d->m_saved_lit = d->m_dict[cur_pos];
          d->m_saved_match_dist = cur_match_dist;
          d->m_saved_match_len = cur_match_len;
        }
      } else {
        tdefl_record_match(d, d->m_saved_match_len, d->m_saved_match_dist);
        len_to_move = d->m_saved_match_len - 1;
        d->m_saved_match_len = 0;
      }
    } else if (!cur_match_dist)
      tdefl_record_literal(d,
                           d->m_dict[MZ_MIN(cur_pos, sizeof(d->m_dict) - 1)]);
    else if ((d->m_greedy_parsing) || (d->m_flags & TDEFL_RLE_MATCHES) ||
             (cur_match_len >= 128)) {
      tdefl_record_match(d, cur_match_len, cur_match_dist);
      len_to_move = cur_match_len;
    } else {
      d->m_saved_lit = d->m_dict[MZ_MIN(cur_pos, sizeof(d->m_dict) - 1)];
      d->m_saved_match_dist = cur_match_dist;
      d->m_saved_match_len = cur_match_len;
    }
    // Move the lookahead forward by len_to_move bytes.
    d->m_lookahead_pos += len_to_move;
    MZ_ASSERT(d->m_lookahead_size >= len_to_move);
    d->m_lookahead_size -= len_to_move;
    d->m_dict_size = MZ_MIN(d->m_dict_size + len_to_move, TDEFL_LZ_DICT_SIZE);
    // Check if it's time to flush the current LZ codes to the internal output
    // buffer.
    if ((d->m_pLZ_code_buf > &d->m_lz_code_buf[TDEFL_LZ_CODE_BUF_SIZE - 8]) ||
        ((d->m_total_lz_bytes > 31 * 1024) &&
         (((((mz_uint)(d->m_pLZ_code_buf - d->m_lz_code_buf) * 115) >> 7) >=
           d->m_total_lz_bytes) ||
          (d->m_flags & TDEFL_FORCE_ALL_RAW_BLOCKS)))) {
      int n;
      d->m_pSrc = pSrc;
      d->m_src_buf_left = src_buf_left;
      if ((n = tdefl_flush_block(d, 0)) != 0)
        return (n < 0) ? MZ_FALSE : MZ_TRUE;
    }
  }

  d->m_pSrc = pSrc;
  d->m_src_buf_left = src_buf_left;
  return MZ_TRUE;
}